

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O1

int XLearnFit(XL *out,char *model_path)

{
  Solver *this;
  HyperParam *hyper_param;
  ostream *poVar1;
  float fVar2;
  Modifier reset;
  Modifier bold;
  Modifier green;
  Timer timer;
  Modifier local_54;
  Modifier local_50;
  Modifier local_4c;
  string local_48;
  Timer local_28;
  
  Timer::Timer(&local_28);
  Timer::tic(&local_28);
  hyper_param = (HyperParam *)*out;
  std::__cxx11::string::string((string *)&local_48,model_path,(allocator *)&local_4c);
  std::__cxx11::string::operator=((string *)&hyper_param->model_file,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  hyper_param->is_train = true;
  this = (Solver *)(hyper_param + 1);
  xLearn::Solver::Initialize(this,hyper_param);
  xLearn::Solver::StartWork(this);
  xLearn::Solver::Clear(this);
  fVar2 = Timer::toc(&local_28);
  StringPrintf_abi_cxx11_(&local_48,"Total time cost: %.2f (sec)",(double)fVar2);
  local_4c.code = FG_GREEN;
  local_50.code = BOLD;
  local_54.code = RESET;
  poVar1 = Color::operator<<((ostream *)&std::cout,&local_4c);
  poVar1 = Color::operator<<(poVar1,&local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[------------] ",0xf);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
  poVar1 = Color::operator<<(poVar1,&local_54);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

XL_DLL int XLearnFit(XL *out, const char *model_path) {
  API_BEGIN();
  Timer timer;
  timer.tic();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  xl->GetHyperParam().model_file = std::string(model_path);
  xl->GetHyperParam().is_train = true;
  xl->GetSolver().Initialize(xl->GetHyperParam());
  xl->GetSolver().StartWork();
  xl->GetSolver().Clear();
  Color::print_info(
    StringPrintf("Total time cost: %.2f (sec)", 
    timer.toc()), true);
  API_END();
}